

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

void duckdb::ArrayGenericFold<float,duckdb::CosineDistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  float fVar1;
  float fVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *count;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  unsigned_long *puVar6;
  pointer pcVar7;
  BoundFunctionExpression *pBVar8;
  reference pvVar9;
  Vector *vector;
  Vector *vector_00;
  idx_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  InvalidInputException *pIVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx;
  idx_t iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  string local_e0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  count = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args->count;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector = ArrayVector::GetEntry(pvVar9);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar9);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar9,(idx_t)count,&local_78);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar9,(idx_t)count,&local_c0);
  pdVar3 = vector->data;
  pdVar4 = vector_00->data;
  pdVar5 = result->data;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  iVar10 = ArrayType::GetSize(&pvVar9->type);
  if (count != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar11 = idx;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_78.sel)->sel_vector[(long)idx];
      }
      pbVar14 = idx;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_c0.sel)->sel_vector[(long)idx];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar11 >> 6] >> ((ulong)pbVar11 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar14 >> 6] >> ((ulong)pbVar14 & 0x3f) & 1) != 0)))) {
        uVar12 = (long)pbVar11 * iVar10;
        puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        iVar15 = iVar10;
        uVar16 = uVar12;
        if (uVar12 < uVar12 + iVar10 && puVar6 != (unsigned_long *)0x0) {
          do {
            if ((puVar6[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
              pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_120[0] = local_110;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"%s: left argument can not contain NULL values","");
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              pcVar7 = (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                       super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar7,
                         pcVar7 + (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                                  super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_120,&local_e0,pbVar14);
              InvalidInputException::InvalidInputException(pIVar13,&local_160);
              __cxa_throw(pIVar13,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            uVar16 = uVar16 + 1;
            iVar15 = iVar15 - 1;
          } while (iVar15 != 0);
        }
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar14 * iVar10);
        puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        iVar15 = iVar10;
        pbVar11 = pbVar14;
        if (pbVar14 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar14->_M_dataplus)._M_p + iVar10) &&
            puVar6 != (unsigned_long *)0x0) {
          do {
            if ((puVar6[(ulong)pbVar11 >> 6] >> ((ulong)pbVar11 & 0x3f) & 1) == 0) {
              pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_140[0] = local_130;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,"%s: right argument can not contain NULL values","");
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              pcVar7 = (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                       super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,pcVar7,
                         pcVar7 + (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                                  super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_140,&local_100,pbVar14);
              InvalidInputException::InvalidInputException(pIVar13,&local_160);
              __cxa_throw(pIVar13,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar11->_M_dataplus)._M_p + 1);
            iVar15 = iVar15 - 1;
          } while (iVar15 != 0);
        }
        if (iVar10 == 0) {
          fVar19 = 0.0;
          fVar18 = 0.0;
        }
        else {
          fVar17 = 0.0;
          fVar18 = 0.0;
          fVar19 = 0.0;
          iVar15 = 0;
          do {
            fVar1 = *(float *)(pdVar3 + iVar15 * 4 + uVar12 * 4);
            fVar2 = *(float *)(pdVar4 + iVar15 * 4 + (long)pbVar14 * 4);
            fVar19 = fVar19 + fVar1 * fVar2;
            fVar17 = fVar17 + fVar1 * fVar1;
            fVar18 = fVar18 + fVar2 * fVar2;
            iVar15 = iVar15 + 1;
          } while (iVar10 != iVar15);
          fVar18 = fVar18 * fVar17;
        }
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar17 = 1.0;
        if (fVar19 / fVar18 <= 1.0) {
          fVar17 = fVar19 / fVar18;
        }
        if (fVar17 <= -1.0) {
          fVar17 = -1.0;
        }
        *(float *)(pdVar5 + (long)idx * 4) = 1.0 - fVar17;
      }
      else {
        FlatVector::SetNull(result,(idx_t)idx,true);
      }
      idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(idx->_M_dataplus)._M_p + 1);
    } while (idx != count);
    if (count == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001)
    {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}